

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::IfStatement(SQCompiler *this)

{
  SQFuncState *pSVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInteger pos;
  SQInteger SVar4;
  bool bVar5;
  SQInteger endifblock;
  SQInteger jnepos;
  bool haselse;
  SQInteger jmppos;
  SQCompiler *this_local;
  
  Lex(this);
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar1 = this->_fs;
  SVar2 = SQFuncState::PopTarget(this->_fs);
  SQFuncState::AddInstruction(pSVar1,_OP_JZ,SVar2,0,0,0);
  SVar2 = SQFuncState::GetCurrentPos(this->_fs);
  IfBlock(this);
  SVar3 = SQFuncState::GetCurrentPos(this->_fs);
  bVar5 = this->_token == 0x111;
  if (bVar5) {
    SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,0,0,0);
    pos = SQFuncState::GetCurrentPos(this->_fs);
    Lex(this);
    IfBlock(this);
    pSVar1 = this->_fs;
    SVar4 = SQFuncState::GetCurrentPos(this->_fs);
    SQFuncState::SetIntructionParam(pSVar1,pos,1,SVar4 - pos);
  }
  SQFuncState::SetIntructionParam(this->_fs,SVar2,1,(SVar3 - SVar2) + (long)(int)(uint)bVar5);
  return;
}

Assistant:

void IfStatement()
    {
        SQInteger jmppos;
        bool haselse = false;
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        SQInteger jnepos = _fs->GetCurrentPos();



        IfBlock();
        //
        /*static int n = 0;
        if (_token != _SC('}') && _token != TK_ELSE) {
            printf("IF %d-----------------------!!!!!!!!!\n", n);
            if (n == 5)
            {
                printf("asd");
            }
            n++;
            //OptionalSemicolon();
        }*/


        SQInteger endifblock = _fs->GetCurrentPos();
        if(_token == TK_ELSE){
            haselse = true;
            //BEGIN_SCOPE();
            _fs->AddInstruction(_OP_JMP);
            jmppos = _fs->GetCurrentPos();
            Lex();
            //Statement(); if(_lex._prevtoken != _SC('}')) OptionalSemicolon();
            IfBlock();
            //END_SCOPE();
            _fs->SetIntructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
        }
        _fs->SetIntructionParam(jnepos, 1, endifblock - jnepos + (haselse?1:0));
    }